

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O2

void TestEq<flatbuffers::Vector<unsigned_char,unsigned_int>const*,flatbuffers::Vector<unsigned_char,unsigned_int>const*>
               (Vector<unsigned_char,_unsigned_int> *expval,Vector<unsigned_char,_unsigned_int> *val
               ,char *exp,char *file,int line,char *func)

{
  Vector<unsigned_char,_unsigned_int> *t;
  string local_70;
  string local_50;
  
  if (expval != val) {
    flatbuffers::NumToString<flatbuffers::Vector<unsigned_char,unsigned_int>const*>
              (&local_50,(flatbuffers *)expval,(Vector<unsigned_char,_unsigned_int> *)exp);
    flatbuffers::NumToString<flatbuffers::Vector<unsigned_char,unsigned_int>const*>
              (&local_70,(flatbuffers *)val,t);
    TestFail(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,exp,file,line,func);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}